

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

timespec __thiscall absl::lts_20240722::ToTimespec(lts_20240722 *this,Time t)

{
  lts_20240722 *plVar1;
  ulong uVar2;
  ulong uVar3;
  timespec tVar4;
  
  uVar3 = (ulong)t.rep_.rep_hi_ >> 2 & 0x3fffffff;
  plVar1 = (lts_20240722 *)0x8000000000000000;
  if (-1 < (long)this) {
    plVar1 = (lts_20240722 *)0x7fffffffffffffff;
  }
  uVar2 = 999999999;
  if (-1 >= (long)this) {
    uVar2 = 0;
  }
  if (t.rep_.rep_hi_.lo_ == 0xffffffff) {
    uVar3 = uVar2;
    this = plVar1;
  }
  tVar4.tv_nsec = uVar3;
  tVar4.tv_sec = (__time_t)this;
  return tVar4;
}

Assistant:

timespec ToTimespec(Time t) {
  timespec ts;
  absl::Duration d = time_internal::ToUnixDuration(t);
  if (!time_internal::IsInfiniteDuration(d)) {
    ts.tv_sec = static_cast<decltype(ts.tv_sec)>(time_internal::GetRepHi(d));
    if (ts.tv_sec == time_internal::GetRepHi(d)) {  // no time_t narrowing
      ts.tv_nsec = time_internal::GetRepLo(d) / 4;  // floor
      return ts;
    }
  }
  if (d >= absl::ZeroDuration()) {
    ts.tv_sec = std::numeric_limits<time_t>::max();
    ts.tv_nsec = 1000 * 1000 * 1000 - 1;
  } else {
    ts.tv_sec = std::numeric_limits<time_t>::min();
    ts.tv_nsec = 0;
  }
  return ts;
}